

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int syncJournal(Pager *pPager,int newHdr)

{
  uint uVar1;
  PCache *pPVar2;
  int iVar3;
  uint uVar4;
  PgHdr *pPVar5;
  sqlite3_int64 sVar6;
  long in_FS_OFFSET;
  u8 zHeader [12];
  u8 aMagic [8];
  undefined8 local_48;
  uint local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = sqlite3PagerExclusiveLock(pPager);
  if (iVar3 != 0) goto LAB_001281b3;
  if (pPager->noSync == '\0') {
    if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) || (pPager->journalMode == '\x04')) {
      pPager->journalHdr = pPager->journalOff;
    }
    else {
      uVar4 = (*pPager->fd->pMethods->xDeviceCharacteristics)(pPager->fd);
      if ((uVar4 >> 9 & 1) == 0) {
        local_48 = 0xd763a120f905d5d9;
        uVar1 = pPager->nRec;
        local_40 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        if (pPager->journalOff == 0) {
          sVar6 = 0;
        }
        else {
          sVar6 = ((pPager->journalOff + -1) / (long)(ulong)pPager->sectorSize + 1) *
                  (ulong)pPager->sectorSize;
        }
        iVar3 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_38,8,sVar6);
        if (iVar3 == 0) {
          if (local_38 == -0x289c5edf06fa2a27) {
            iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,"",1,sVar6);
            goto LAB_001282a4;
          }
        }
        else {
LAB_001282a4:
          if ((iVar3 != 0x20a) && (iVar3 != 0)) goto LAB_001281b3;
        }
        if ((((uVar4 & 0x400) == 0) &&
            ((pPager->fullSync != '\0' &&
             (iVar3 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,(uint)pPager->syncFlags),
             iVar3 != 0)))) ||
           (iVar3 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_48,0xc,pPager->journalHdr),
           iVar3 != 0)) goto LAB_001281b3;
      }
      if (((uVar4 & 0x400) == 0) &&
         (iVar3 = (*pPager->jfd->pMethods->xSync)
                            (pPager->jfd,
                             (uint)(pPager->syncFlags == 3) << 4 | (uint)pPager->syncFlags),
         iVar3 != 0)) goto LAB_001281b3;
      pPager->journalHdr = pPager->journalOff;
      if ((newHdr != 0) && ((uVar4 & 0x200) == 0)) {
        pPager->nRec = 0;
        iVar3 = writeJournalHdr(pPager);
        if (iVar3 != 0) goto LAB_001281b3;
      }
    }
  }
  pPVar2 = pPager->pPCache;
  for (pPVar5 = pPVar2->pDirty; pPVar5 != (PgHdr *)0x0; pPVar5 = pPVar5->pDirtyNext) {
    *(byte *)&pPVar5->flags = (byte)pPVar5->flags & 0xf7;
  }
  pPVar2->pSynced = pPVar2->pDirtyTail;
  pPager->eState = '\x04';
  iVar3 = 0;
LAB_001281b3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int syncJournal(Pager *pPager, int newHdr){
  int rc;                         /* Return code */

  assert( pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( !pagerUseWal(pPager) );

  rc = sqlite3PagerExclusiveLock(pPager);
  if( rc!=SQLITE_OK ) return rc;

  if( !pPager->noSync ){
    assert( !pPager->tempFile );
    if( isOpen(pPager->jfd) && pPager->journalMode!=PAGER_JOURNALMODE_MEMORY ){
      const int iDc = sqlite3OsDeviceCharacteristics(pPager->fd);
      assert( isOpen(pPager->jfd) );

      if( 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        /* This block deals with an obscure problem. If the last connection
        ** that wrote to this database was operating in persistent-journal
        ** mode, then the journal file may at this point actually be larger
        ** than Pager.journalOff bytes. If the next thing in the journal
        ** file happens to be a journal-header (written as part of the
        ** previous connection's transaction), and a crash or power-failure 
        ** occurs after nRec is updated but before this connection writes 
        ** anything else to the journal file (or commits/rolls back its 
        ** transaction), then SQLite may become confused when doing the 
        ** hot-journal rollback following recovery. It may roll back all
        ** of this connections data, then proceed to rolling back the old,
        ** out-of-date data that follows it. Database corruption.
        **
        ** To work around this, if the journal file does appear to contain
        ** a valid header following Pager.journalOff, then write a 0x00
        ** byte to the start of it to prevent it from being recognized.
        **
        ** Variable iNextHdrOffset is set to the offset at which this
        ** problematic header will occur, if it exists. aMagic is used 
        ** as a temporary buffer to inspect the first couple of bytes of
        ** the potential journal header.
        */
        i64 iNextHdrOffset;
        u8 aMagic[8];
        u8 zHeader[sizeof(aJournalMagic)+4];

        memcpy(zHeader, aJournalMagic, sizeof(aJournalMagic));
        put32bits(&zHeader[sizeof(aJournalMagic)], pPager->nRec);

        iNextHdrOffset = journalHdrOffset(pPager);
        rc = sqlite3OsRead(pPager->jfd, aMagic, 8, iNextHdrOffset);
        if( rc==SQLITE_OK && 0==memcmp(aMagic, aJournalMagic, 8) ){
          static const u8 zerobyte = 0;
          rc = sqlite3OsWrite(pPager->jfd, &zerobyte, 1, iNextHdrOffset);
        }
        if( rc!=SQLITE_OK && rc!=SQLITE_IOERR_SHORT_READ ){
          return rc;
        }

        /* Write the nRec value into the journal file header. If in
        ** full-synchronous mode, sync the journal first. This ensures that
        ** all data has really hit the disk before nRec is updated to mark
        ** it as a candidate for rollback.
        **
        ** This is not required if the persistent media supports the
        ** SAFE_APPEND property. Because in this case it is not possible 
        ** for garbage data to be appended to the file, the nRec field
        ** is populated with 0xFFFFFFFF when the journal header is written
        ** and never needs to be updated.
        */
        if( pPager->fullSync && 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
          PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
          IOTRACE(("JSYNC %p\n", pPager))
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
          if( rc!=SQLITE_OK ) return rc;
        }
        IOTRACE(("JHDR %p %lld\n", pPager, pPager->journalHdr));
        rc = sqlite3OsWrite(
            pPager->jfd, zHeader, sizeof(zHeader), pPager->journalHdr
        );
        if( rc!=SQLITE_OK ) return rc;
      }
      if( 0==(iDc&SQLITE_IOCAP_SEQUENTIAL) ){
        PAGERTRACE(("SYNC journal of %d\n", PAGERID(pPager)));
        IOTRACE(("JSYNC %p\n", pPager))
        rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags| 
          (pPager->syncFlags==SQLITE_SYNC_FULL?SQLITE_SYNC_DATAONLY:0)
        );
        if( rc!=SQLITE_OK ) return rc;
      }

      pPager->journalHdr = pPager->journalOff;
      if( newHdr && 0==(iDc&SQLITE_IOCAP_SAFE_APPEND) ){
        pPager->nRec = 0;
        rc = writeJournalHdr(pPager);
        if( rc!=SQLITE_OK ) return rc;
      }
    }else{
      pPager->journalHdr = pPager->journalOff;
    }
  }

  /* Unless the pager is in noSync mode, the journal file was just 
  ** successfully synced. Either way, clear the PGHDR_NEED_SYNC flag on 
  ** all pages.
  */
  sqlite3PcacheClearSyncFlags(pPager->pPCache);
  pPager->eState = PAGER_WRITER_DBMOD;
  assert( assert_pager_state(pPager) );
  return SQLITE_OK;
}